

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O3

void e2e_fdb_del_person(storage_t *st,person_t *p)

{
  __atomic_base<unsigned_long> __s2;
  kvs_ops_stat *__s1;
  bool bVar1;
  fdb_status fVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  checkpoint_t *pcVar6;
  __atomic_base<unsigned_long> _Var7;
  _func_voidref_void_ptr_bid_t_ptr *p_Var8;
  _func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *p_Var9;
  list_elem *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *markers_out;
  filemgr *__ptr;
  undefined4 uVar10;
  fdb_doc *pfVar11;
  checkpoint_t *handle_in;
  char *pcVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fhandle;
  char *handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar15;
  fdb_kvs_handle **unaff_R13;
  long lVar16;
  list *plVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_418;
  uint64_t uStackY_410;
  list_elem *plStackY_408;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_400;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_3f8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_3e8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_3e0;
  timeval tStackY_3d8;
  checkpoint_t *pcStackY_3c8;
  fdb_kvs_handle *pfStackY_3c0;
  fdb_kvs_handle **ppfStackY_3b8;
  fdb_kvs_handle *pfStackY_3b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_3a8;
  filemgr *pfStackY_3a0;
  fdb_doc *pfStack_388;
  fdb_iterator *pfStack_380;
  list_elem lStack_378;
  idx_prams_t iStack_368;
  timeval tStack_350;
  fdb_kvs_handle *pfStack_340;
  fdb_kvs_handle *pfStack_338;
  fdb_kvs_handle **ppfStack_330;
  checkpoint_t *pcStack_328;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_320;
  filemgr *pfStack_318;
  fdb_doc *pfStack_308;
  timeval tStack_300;
  undefined1 auStack_2f0 [48];
  char acStack_2c0 [264];
  fdb_kvs_handle *pfStack_1b8;
  checkpoint_t *pcStack_1b0;
  fdb_doc *pfStack_1a0;
  timeval tStack_198;
  atomic<unsigned_long> aStack_188;
  fdb_kvs_handle *pfStack_180;
  atomic<unsigned_long> aStack_178;
  fdb_kvs_handle *pfStack_168;
  filemgr *pfStack_160;
  fdb_kvs_handle *pfStack_158;
  fdb_iterator *pfStack_150;
  char acStack_144 [4];
  fdb_kvs_handle *pfStack_140;
  fdb_kvs_handle *pfStack_138;
  fdb_kvs_handle *pfStack_130;
  fdb_kvs_handle *pfStack_128;
  size_t sStack_120;
  timeval tStack_118;
  fdb_kvs_info fStack_108;
  fdb_kvs_handle *pfStack_d8;
  fdb_kvs_handle *pfStack_d0;
  fdb_doc *pfStack_a0;
  timeval tStack_98;
  ulong uStack_88;
  fdb_kvs_handle *pfStack_80;
  char *apcStack_78 [2];
  timeval tStack_68;
  person_t *ppStack_58;
  storage_t *psStack_50;
  fdb_doc *local_40;
  timeval local_38;
  
  handle = (char *)0x0;
  psStack_50 = (storage_t *)0x1097c1;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  pcVar12 = (char *)&local_40;
  local_40 = (fdb_doc *)0x0;
  psStack_50 = (storage_t *)0x1097d1;
  sVar5 = strlen(p->key);
  psStack_50 = (storage_t *)0x1097eb;
  fdb_doc_create((fdb_doc **)pcVar12,p,sVar5,(void *)0x0,0,(void *)0x0,0);
  psStack_50 = (storage_t *)0x1097f7;
  fVar2 = fdb_get(st->all_docs,local_40);
  __ptr = (filemgr *)(ulong)(uint)fVar2;
  pfVar13 = st->all_docs;
  psStack_50 = (storage_t *)0x109805;
  pfVar11 = local_40;
  fVar3 = fdb_del(pfVar13,local_40);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (char *)st->index1;
    pcVar12 = p->name;
    psStack_50 = (storage_t *)0x109820;
    sVar5 = strlen(pcVar12);
    psStack_50 = (storage_t *)0x10982e;
    pfVar11 = (fdb_doc *)pcVar12;
    pfVar13 = (fdb_kvs_handle *)handle;
    fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,pcVar12,sVar5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001098b9;
    handle = (char *)st->index2;
    psStack_50 = (storage_t *)0x109842;
    sVar5 = strlen(pcVar12);
    psStack_50 = (storage_t *)0x109850;
    pfVar11 = (fdb_doc *)pcVar12;
    pfVar13 = (fdb_kvs_handle *)handle;
    fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,pcVar12,sVar5);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      psStack_50 = (storage_t *)0x10986d;
      save_tx(st,local_40->key,local_40->keylen,2);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        psStack_50 = (storage_t *)0x10987d;
        bVar1 = is_indexed(st->index_params,p);
        pcVar6 = st->v_chk;
        if (bVar1) {
          pcVar6->num_indexed = pcVar6->num_indexed + -1;
          pcVar6->sum_age_indexed = pcVar6->sum_age_indexed - p->age;
        }
        pcVar6->ndocs = pcVar6->ndocs + -1;
      }
      psStack_50 = (storage_t *)0x1098a7;
      fdb_doc_free(local_40);
      return;
    }
  }
  else {
    psStack_50 = (storage_t *)0x1098b9;
    e2e_fdb_del_person_cold_1();
LAB_001098b9:
    psStack_50 = (storage_t *)0x1098be;
    e2e_fdb_del_person_cold_2();
  }
  psStack_50 = (storage_t *)e2e_fdb_commit;
  e2e_fdb_del_person_cold_3();
  apcStack_78[0] = (char *)0x1098db;
  ppStack_58 = p;
  psStack_50 = st;
  gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
  apcStack_78[0] = (char *)0x1098e5;
  pfVar14 = pfVar13;
  fVar2 = fdb_commit((fdb_file_handle *)pfVar13,(fdb_commit_opt_t)pfVar11);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    return;
  }
  apcStack_78[0] = (char *)start_checkpoint;
  e2e_fdb_commit_cold_1();
  uStack_88 = (ulong)pfVar11 & 0xffffffff;
  pfStack_80 = pfVar13;
  apcStack_78[0] = pcVar12;
  gettimeofday(&tStack_98,(__timezone_ptr_t)0x0);
  pfStack_a0 = (fdb_doc *)0x0;
  pfVar13 = (fdb_kvs_handle *)pfVar14->op_stats;
  uVar10._0_1_ = '\x02';
  uVar10._1_1_ = '\0';
  uVar10._2_1_ = '\0';
  uVar10._3_1_ = '\0';
  fVar2 = fdb_begin_transaction((fdb_file_handle *)pfVar13,'\x02');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar6 = create_checkpoint((storage_t *)pfVar14,5);
    sVar5 = strlen(pcVar6->key);
    fdb_doc_create(&pfStack_a0,pcVar6,sVar5,(void *)0x0,0,pcVar6,0x430);
    save_tx((storage_t *)pfVar14,pfStack_a0->key,pfStack_a0->keylen,5);
    pfVar13 = (fdb_kvs_handle *)pfVar14->trie;
    pfVar11 = pfStack_a0;
    fVar2 = fdb_set(pfVar13,pfStack_a0);
    uVar10 = SUB84(pfVar11,0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      free(pcVar6);
      fdb_doc_free(pfStack_a0);
      return;
    }
  }
  else {
    start_checkpoint_cold_1();
  }
  start_checkpoint_cold_2();
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099d7;
  acStack_144 = (char  [4])uVar10;
  pfStack_d8 = pfVar14;
  pfStack_d0 = (fdb_kvs_handle *)handle;
  gettimeofday(&tStack_118,(__timezone_ptr_t)0x0);
  pfStack_168 = (fdb_kvs_handle *)0x0;
  __s2._M_i = (__int_type)(pfVar13->field_6).seqtree;
  pfStack_160 = (filemgr *)0x0;
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099f4;
  _Var7._M_i = (__int_type)calloc(1,0x430);
  pfVar14 = (fdb_kvs_handle *)pfVar13->trie;
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a05;
  fVar2 = fdb_get_kvs_info(pfVar14,&fStack_108);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_158 = (fdb_kvs_handle *)(__s2._M_i + 0xc);
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a23;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar13->kvs_config,*(bool *)((long)&pfVar13->file + 6));
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a32;
    p_Var8 = (_func_voidref_void_ptr_bid_t_ptr *)
             last_snap_seqnum((storage_t *)pfVar13,"e2ekv_alldocs");
    ((btree_blk_ops *)(_Var7._M_i + 0x410))->blk_alloc = p_Var8;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a48;
    p_Var8 = (_func_voidref_void_ptr_bid_t_ptr *)
             last_snap_seqnum((storage_t *)pfVar13,"e2ekv_index1");
    *(_func_voidref_void_ptr_bid_t_ptr **)(_Var7._M_i + 0x418) = p_Var8;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a5e;
    p_Var9 = (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)
             last_snap_seqnum((storage_t *)pfVar13,"e2ekv_index2");
    *(_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr **)(_Var7._M_i + 0x420) = p_Var9;
    lVar16 = 0;
    __ptr = (filemgr *)0x8421084210842109;
    handle = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    do {
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a7e;
      iVar4 = rand();
      *(char *)(_Var7._M_i + lVar16) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar4 % 0x3e];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0xc);
    *(undefined1 *)(_Var7._M_i + 0xb) = 0;
    *(undefined4 *)(_Var7._M_i + 0x400) = (undefined4)fStack_108.doc_count;
    *(undefined2 *)(_Var7._M_i + 0x40c) = 0;
    *(short *)(_Var7._M_i + 0x428) = acStack_144._0_2_;
    pfVar14 = (fdb_kvs_handle *)(pfVar13->kvs_config).custom_cmp;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ae6;
    fVar2 = fdb_snapshot_open(pfVar14,&pfStack_140,
                              (fdb_seqnum_t)((btree_blk_ops *)(_Var7._M_i + 0x410))->blk_alloc);
    unaff_R13 = (fdb_kvs_handle **)0xc;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109cc9;
    pfVar14 = (fdb_kvs_handle *)(pfVar13->kvs_config).custom_cmp_param;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b03;
    fVar2 = fdb_snapshot_open(pfVar14,&pfStack_130,
                              (fdb_seqnum_t)
                              *(_func_voidref_void_ptr_bid_t_ptr **)(_Var7._M_i + 0x418));
    handle = (char *)pfStack_158;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109cce;
    pfVar14 = (fdb_kvs_handle *)pfVar13->kvs;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b25;
    fVar2 = fdb_snapshot_open(pfVar14,&pfStack_138,
                              (fdb_seqnum_t)
                              *(_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr **)
                               (_Var7._M_i + 0x420));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b54;
      fVar2 = fdb_iterator_init(pfStack_130,&pfStack_150,(void *)__s2._M_i,0xc,handle,0xc,2);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfVar13 = (fdb_kvs_handle *)&pfVar13->file;
        unaff_R13 = &pfStack_168;
        do {
          aStack_178.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109b75;
          fVar2 = fdb_iterator_get(pfStack_150,(fdb_doc **)unaff_R13);
          handle = (char *)pfStack_168;
          if (fVar2 == FDB_RESULT_SUCCESS) {
            __s1 = pfStack_168->op_stats;
            aStack_178.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109b92;
            iVar4 = strcmp((char *)__s1,(char *)__s2._M_i);
            if (iVar4 < 0) {
LAB_00109c55:
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c6a;
              create_checkpoint_cold_5();
              handle = (char *)pfStack_128;
            }
            else {
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109ba7;
              iVar4 = strcmp((char *)__s1,(char *)pfStack_158);
              if (0 < iVar4) goto LAB_00109c55;
            }
            aStack_178.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109bcd;
            fVar2 = fdb_get_kv(pfStack_140,(((fdb_kvs_handle *)handle)->field_6).seqtree,
                               (size_t)(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp_param,
                               &pfStack_160,&sStack_120);
            __ptr = pfStack_160;
            if (fVar2 == FDB_RESULT_SUCCESS) {
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109be5;
              iVar4 = strcmp((char *)(pfStack_160[4].encryption.key.bytes + 4),(char *)pfVar13);
              if (iVar4 == 0) {
                *(int *)(_Var7._M_i + 0x404) = *(int *)(_Var7._M_i + 0x404) + 1;
                aStack_178.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)0x109bfe;
                pfVar14 = pfStack_138;
                fVar2 = fdb_get(pfStack_138,(fdb_doc *)pfStack_168);
                if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109cd8;
                *(int *)(_Var7._M_i + 0x408) =
                     *(int *)(_Var7._M_i + 0x408) + *(int *)(pfStack_168->field_6).seqtree;
                __ptr = pfStack_160;
              }
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c24;
              free(__ptr);
              pfStack_160 = (filemgr *)0x0;
            }
            aStack_178.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109c37;
            fdb_doc_free((fdb_doc *)pfStack_168);
            pfStack_168 = (fdb_kvs_handle *)0x0;
          }
          aStack_178.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109c4a;
          fVar2 = fdb_iterator_next(pfStack_150);
          pfVar14 = pfStack_168;
        } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      }
      else {
        pfVar14 = (fdb_kvs_handle *)0x0;
      }
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c7e;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_168 = (fdb_kvs_handle *)0x0;
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c91;
      fdb_iterator_close(pfStack_150);
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c9b;
      fdb_kvs_close(pfStack_140);
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ca5;
      fdb_kvs_close(pfStack_130);
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109caf;
      fdb_kvs_close(pfStack_138);
      return;
    }
  }
  else {
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cc9;
    create_checkpoint_cold_1();
LAB_00109cc9:
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cce;
    create_checkpoint_cold_2();
LAB_00109cce:
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cd3;
    create_checkpoint_cold_3();
  }
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cd8;
  create_checkpoint_cold_4();
LAB_00109cd8:
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)end_checkpoint;
  create_checkpoint_cold_6();
  pcStack_1b0 = (checkpoint_t *)0x109cf5;
  aStack_188.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var7._M_i;
  pfStack_180 = pfVar13;
  aStack_178.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s2._M_i;
  gettimeofday(&tStack_198,(__timezone_ptr_t)0x0);
  pfStack_1a0 = (fdb_doc *)0x0;
  pcStack_1b0 = (checkpoint_t *)0x109d0e;
  pcVar6 = create_checkpoint((storage_t *)pfVar14,6);
  pcStack_1b0 = (checkpoint_t *)0x109d19;
  sVar5 = strlen(pcVar6->key);
  pcStack_1b0 = (checkpoint_t *)0x109d37;
  fdb_doc_create(&pfStack_1a0,pcVar6,sVar5,(void *)0x0,0,pcVar6,0x430);
  pcStack_1b0 = (checkpoint_t *)0x109d4e;
  save_tx((storage_t *)pfVar14,pfStack_1a0->key,pfStack_1a0->keylen,6);
  pfVar13 = (fdb_kvs_handle *)pfVar14->op_stats;
  pcStack_1b0 = (checkpoint_t *)0x109d5b;
  fVar2 = fdb_end_transaction((fdb_file_handle *)pfVar13,
                              *(fdb_commit_opt_t *)((long)&pfVar14->file + 6));
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar13 = (fdb_kvs_handle *)pfVar14->trie;
    pcStack_1b0 = (checkpoint_t *)0x109d6d;
    fVar2 = fdb_set(pfVar13,pfStack_1a0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1b0 = (checkpoint_t *)0x109d79;
      free(pcVar6);
      pcStack_1b0 = (checkpoint_t *)0x109d83;
      fdb_doc_free(pfStack_1a0);
      return;
    }
  }
  else {
    pcStack_1b0 = (checkpoint_t *)0x109d92;
    end_checkpoint_cold_1();
  }
  pcStack_1b0 = (checkpoint_t *)e2e_fdb_cancel_checkpoint;
  end_checkpoint_cold_2();
  pfStack_318 = (filemgr *)0x109db0;
  pfStack_1b8 = pfVar14;
  pcStack_1b0 = pcVar6;
  gettimeofday(&tStack_300,(__timezone_ptr_t)0x0);
  pfStack_308 = (fdb_doc *)0x0;
  pfVar14 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)&pfVar13->trie)->super___atomic_base<unsigned_long>)._M_i;
  handle_in = (checkpoint_t *)auStack_2f0;
  pfStack_318 = (filemgr *)0x109dc7;
  fVar2 = fdb_get_kvs_info(pfVar14,(fdb_kvs_info *)handle_in);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_kvs_handle *)&pfStack_308;
    handle_in = (checkpoint_t *)0x0;
    pfStack_318 = (filemgr *)0x109ded;
    fVar2 = fdb_doc_create((fdb_doc **)pfVar14,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109eec;
    pfStack_308->seqnum = auStack_2f0._8_8_;
    pfStack_318 = (filemgr *)0x109e0c;
    fdb_get_byseq((fdb_kvs_handle *)
                  (((atomic<unsigned_long> *)&pfVar13->trie)->super___atomic_base<unsigned_long>).
                  _M_i,pfStack_308);
    pcVar6 = (checkpoint_t *)pfStack_308->body;
    if (pcVar6->type != 5) {
      pfStack_318 = (filemgr *)0x109e2c;
      e2e_fdb_cancel_checkpoint_cold_3();
    }
    pfVar14 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp;
    handle_in = (checkpoint_t *)pcVar6->seqnum_all;
    pfStack_318 = (filemgr *)0x109e3c;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pfVar14,(fdb_seqnum_t)handle_in);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109ef1;
    pfVar14 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp_param;
    handle_in = (checkpoint_t *)pcVar6->seqnum_idx1;
    pfStack_318 = (filemgr *)0x109e54;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pfVar14,(fdb_seqnum_t)handle_in);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109ef6;
    pfVar14 = (fdb_kvs_handle *)&pfVar13->kvs;
    handle_in = (checkpoint_t *)pcVar6->seqnum_idx2;
    pfStack_318 = (filemgr *)0x109e6c;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pfVar14,(fdb_seqnum_t)handle_in);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00109efb;
    pfStack_318 = (filemgr *)0x109e85;
    handle_in = pcVar6;
    memcpy(pfVar13->staletree,pcVar6,0x430);
    pfVar14 = (fdb_kvs_handle *)
              (((atomic<unsigned_long> *)&pfVar13->op_stats)->super___atomic_base<unsigned_long>).
              _M_i;
    pfStack_318 = (filemgr *)0x109e8e;
    fVar2 = fdb_abort_transaction((fdb_file_handle *)pfVar14);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_318 = (filemgr *)0x109eaf;
      sprintf(auStack_2f0 + 0x30,"revert to checkpoint[seqno:%lu]\n",pcVar6->seqnum_all);
      pcVar12 = "%s PASSED\n";
      if (e2e_fdb_cancel_checkpoint::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_318 = (filemgr *)0x109edc;
      fprintf(_stderr,pcVar12,auStack_2f0 + 0x30);
      return;
    }
  }
  else {
    pfStack_318 = (filemgr *)0x109eec;
    e2e_fdb_cancel_checkpoint_cold_1();
LAB_00109eec:
    pfStack_318 = (filemgr *)0x109ef1;
    e2e_fdb_cancel_checkpoint_cold_2();
LAB_00109ef1:
    pfStack_318 = (filemgr *)0x109ef6;
    e2e_fdb_cancel_checkpoint_cold_4();
LAB_00109ef6:
    pfStack_318 = (filemgr *)0x109efb;
    e2e_fdb_cancel_checkpoint_cold_5();
LAB_00109efb:
    pfStack_318 = (filemgr *)0x109f00;
    e2e_fdb_cancel_checkpoint_cold_6();
  }
  pfStack_318 = (filemgr *)scan;
  e2e_fdb_cancel_checkpoint_cold_7();
  pfStackY_3a0 = (filemgr *)0x109f25;
  pfStack_340 = pfVar13;
  pfStack_338 = (fdb_kvs_handle *)handle;
  ppfStack_330 = unaff_R13;
  pcStack_328 = pcVar6;
  aStack_320.seqtree = (btree *)&pfStack_1a0;
  pfStack_318 = __ptr;
  gettimeofday(&tStack_350,(__timezone_ptr_t)0x0);
  pfStack_388 = (fdb_doc *)0x0;
  pfStackY_3a0 = (filemgr *)0x109f38;
  gen_index_params(&iStack_368);
  if (handle_in != (checkpoint_t *)0x0) {
    pfStackY_3a0 = (filemgr *)0x109f51;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)handle_in,(fdb_kvs_handle **)&lStack_378,
                              0xffffffffffffffff);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00109f77;
    pfStackY_3a0 = (filemgr *)0x109f5a;
    scan_cold_1();
  }
  paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(pfVar14->kvs_config).custom_cmp_param;
  ptr_handle = &lStack_378;
  pfStackY_3a0 = (filemgr *)0x109f6f;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)paVar15,(fdb_kvs_handle **)ptr_handle,
                            0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pfStackY_3a0 = (filemgr *)last_snap_seqnum;
    scan_cold_2();
    aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a070;
    pcStackY_3c8 = handle_in;
    pfStackY_3c0 = (fdb_kvs_handle *)handle;
    ppfStackY_3b8 = unaff_R13;
    pfStackY_3b0 = pfVar14;
    aStackY_3a8.seqtree = (btree *)&pfStack_1a0;
    pfStackY_3a0 = __ptr;
    gettimeofday(&tStackY_3d8,(__timezone_ptr_t)0x0);
    fhandle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)paVar15->seqtree;
    markers_out = &aStackY_3e8;
    aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a082;
    fVar2 = fdb_get_all_snap_markers
                      ((fdb_file_handle *)fhandle.seqtree,
                       (fdb_snapshot_info_t **)&markers_out->seqtree,(uint64_t *)&paStackY_3e0);
    paStackY_400 = paVar15;
    aVar18.seqtree = (btree *)&pfStack_1a0;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      if (paStackY_3e0 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
        paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        do {
          plVar17 = (list *)(&(aStackY_3e8.seqtree)->root_bid)[(long)paVar15 * 3];
          if (0 < (long)plVar17) {
            __ptr = (filemgr *)
                    &((list *)(&(aStackY_3e8.seqtree)->blk_handle)[(long)paVar15 * 3])->tail;
            do {
              aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0c2;
              iVar4 = strcmp(*(char **)&__ptr[-1].fhandle_idx_lock,(char *)ptr_handle);
              if (iVar4 == 0) goto LAB_0010a0eb;
              __ptr = (filemgr *)&__ptr->blocksize;
              plVar17 = (list *)((long)&plVar17[-1].tail + 7);
            } while (plVar17 != (list *)0x0);
          }
          paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)paVar15 + 1);
        } while (paVar15 != paStackY_3e0);
      }
      aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0e2;
      markers_out = paStackY_3e0;
      fhandle = aStackY_3e8;
      fVar2 = fdb_free_snap_markers
                        ((fdb_snapshot_info_t *)aStackY_3e8.seqtree,(uint64_t)paStackY_3e0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0eb;
        last_snap_seqnum();
LAB_0010a0eb:
        ptr_handle = (list_elem *)__ptr->filename;
        aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0fa;
        markers_out = paStackY_3e0;
        fhandle = aStackY_3e8;
        fVar2 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStackY_3e8.seqtree,(uint64_t)paStackY_3e0);
        if (fVar2 == FDB_RESULT_SUCCESS) {
          return;
        }
      }
      aStackY_3f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a115;
      last_snap_seqnum();
      paStackY_400 = paStackY_3e0;
      aVar18 = aStackY_3e8;
    }
    aStackY_3f8.seqtree = (btree *)print_n_markers;
    last_snap_seqnum();
    plStackY_408 = ptr_handle;
    aStackY_3f8 = aVar18;
    fdb_get_all_snap_markers
              ((fdb_file_handle *)*(fdb_kvs_handle **)&(fhandle.seqtree)->ksize,&pfStackY_418,
               &uStackY_410);
    if (markers_out != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
      lVar16 = 0x10;
      do {
        printf("marker:  %lu\n",*(undefined8 *)(*(long *)((long)&pfStackY_418->marker + lVar16) + 8)
              );
        lVar16 = lVar16 + 0x18;
        markers_out = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)markers_out + -1);
      } while (markers_out != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0);
    }
    return;
  }
LAB_00109f77:
  pfStackY_3a0 = (filemgr *)0x109fa5;
  fVar2 = fdb_iterator_init((fdb_kvs_handle *)lStack_378.prev,&pfStack_380,&iStack_368,0xc,
                            iStack_368.max,0xc,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    do {
      pfStackY_3a0 = (filemgr *)0x109fe3;
      fVar2 = fdb_iterator_get(pfStack_380,&pfStack_388);
      pfVar11 = pfStack_388;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar12 = (char *)pfStack_388->key;
        pfStackY_3a0 = (filemgr *)0x109ffb;
        iVar4 = strcmp(pcVar12,iStack_368.min);
        if (iVar4 < 0) {
LAB_0010a033:
          pfStackY_3a0 = (filemgr *)0x10a044;
          scan_cold_3();
          pfVar11 = (fdb_doc *)lStack_378.next;
        }
        else {
          pfStackY_3a0 = (filemgr *)0x10a00a;
          iVar4 = strcmp(pcVar12,iStack_368.max);
          if (0 < iVar4) goto LAB_0010a033;
        }
        pfStackY_3a0 = (filemgr *)0x10a016;
        fdb_doc_free(pfVar11);
        pfStack_388 = (fdb_doc *)0x0;
      }
      pfStackY_3a0 = (filemgr *)0x10a029;
      fVar2 = fdb_iterator_next(pfStack_380);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  }
  pfStackY_3a0 = (filemgr *)0x109fb3;
  fdb_iterator_close(pfStack_380);
  return;
}

Assistant:

void e2e_fdb_del_person(storage_t *st, person_t *p){
    TEST_INIT();

    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    fdb_doc_create(&doc, p->key, strlen(p->key), NULL, 0, NULL, 0);

    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_del(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_del_kv(st->index1, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_del_kv(st->index2, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, DEL_PERSON);

    if(existed){ // check if was indexed
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed--;
            st->v_chk->sum_age_indexed-=p->age;
        }
        st->v_chk->ndocs -= 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}